

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

void cf_he_adjust_pollset(Curl_cfilter *cf,Curl_easy *data,easy_pollset *ps)

{
  void *pvVar1;
  Curl_cfilter *cf_00;
  curl_trc_feat *pcVar2;
  bool bVar3;
  long lVar4;
  bool bVar5;
  
  if ((cf->field_0x24 & 1) == 0) {
    pvVar1 = cf->ctx;
    lVar4 = 0;
    bVar3 = true;
    do {
      bVar5 = bVar3;
      lVar4 = *(long *)((long)pvVar1 + lVar4 * 8 + 0x20);
      if ((lVar4 != 0) && (cf_00 = *(Curl_cfilter **)(lVar4 + 0x28), cf_00 != (Curl_cfilter *)0x0))
      {
        Curl_conn_cf_adjust_pollset(cf_00,data,ps);
      }
      lVar4 = 1;
      bVar3 = false;
    } while (bVar5);
    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) {
      pcVar2 = (data->state).feat;
      if (pcVar2 == (curl_trc_feat *)0x0) {
        if (cf == (Curl_cfilter *)0x0) {
          return;
        }
      }
      else {
        if (cf == (Curl_cfilter *)0x0) {
          return;
        }
        if (pcVar2->log_level < 1) {
          return;
        }
      }
      if (0 < cf->cft->log_level) {
        Curl_trc_cf_infof(data,cf,"adjust_pollset -> %d socks",(ulong)ps->num);
        return;
      }
    }
  }
  return;
}

Assistant:

static void cf_he_adjust_pollset(struct Curl_cfilter *cf,
                                  struct Curl_easy *data,
                                  struct easy_pollset *ps)
{
  struct cf_he_ctx *ctx = cf->ctx;
  size_t i;

  if(!cf->connected) {
    for(i = 0; i < CURL_ARRAYSIZE(ctx->baller); i++) {
      struct eyeballer *baller = ctx->baller[i];
      if(!baller || !baller->cf)
        continue;
      Curl_conn_cf_adjust_pollset(baller->cf, data, ps);
    }
    CURL_TRC_CF(data, cf, "adjust_pollset -> %d socks", ps->num);
  }
}